

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O2

void __thiscall mp::QP2Passes::RunPass1(QP2Passes *this)

{
  Impl *pIVar1;
  bool bVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_type __n;
  reference rVar7;
  
  InitPass1(this);
  pIVar1 = (this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
           impl_;
  __n = 0;
  for (lVar6 = (long)(int)pIVar1[1].kind_ << 3; lVar6 != 0; lVar6 = lVar6 + -8) {
    bVar2 = QP2PassVisitor::Process
                      (this->visitor_,(ExprBase)*(ExprBase *)&pIVar1[__n * 2 + 2].kind_);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_term_qp_,__n);
    uVar5 = rVar7._M_mask;
    puVar3 = rVar7._M_p;
    if (bVar2) {
      uVar4 = *puVar3 | uVar5;
    }
    else {
      uVar4 = ~uVar5 & *puVar3;
    }
    *puVar3 = uVar4;
    if ((uVar4 & uVar5) != 0) {
      this->n_qp_terms_ = this->n_qp_terms_ + 1;
    }
    __n = __n + 1;
  }
  return;
}

Assistant:

void QP2Passes::RunPass1() {
  InitPass1();
  auto e0 = GetTopExpr();
  int term_index=0;
  for (auto term_iter=e0.begin(), term_end=e0.end();
       term_end!=term_iter; ++term_iter, ++term_index) {
    if ((is_term_qp_[term_index]             // degree > 2
          = visitor_.Process(*term_iter))) {
      ++n_qp_terms_;
    }
  }
}